

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jwt.h
# Opt level: O1

date __thiscall jwt::payload::get_issued_at(payload *this)

{
  claim *this_00;
  int64_t iVar1;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"iat","");
  this_00 = get_payload_claim(this,&local_38);
  iVar1 = claim::as_int(this_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return (date)(iVar1 * 1000000000);
}

Assistant:

const date get_issued_at() const { return get_payload_claim("iat").as_date(); }